

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O0

void IDAFree(void **ida_mem)

{
  long *in_RDI;
  IDAMem IDA_mem;
  IDAMem IDA_mem_00;
  
  if (*in_RDI != 0) {
    IDA_mem_00 = (IDAMem)*in_RDI;
    IDAFreeVectors(IDA_mem_00);
    if (IDA_mem_00->ownNLS != 0) {
      SUNNonlinSolFree(IDA_mem_00->NLS);
      IDA_mem_00->ownNLS = 0;
      IDA_mem_00->NLS = (SUNNonlinearSolver)0x0;
    }
    if (IDA_mem_00->ida_lfree != (_func_int_IDAMemRec_ptr *)0x0) {
      (*IDA_mem_00->ida_lfree)(IDA_mem_00);
    }
    if (0 < IDA_mem_00->ida_nrtfn) {
      free(IDA_mem_00->ida_glo);
      IDA_mem_00->ida_glo = (sunrealtype *)0x0;
      free(IDA_mem_00->ida_ghi);
      IDA_mem_00->ida_ghi = (sunrealtype *)0x0;
      free(IDA_mem_00->ida_grout);
      IDA_mem_00->ida_grout = (sunrealtype *)0x0;
      free(IDA_mem_00->ida_iroots);
      IDA_mem_00->ida_iroots = (int *)0x0;
      free(IDA_mem_00->ida_rootdir);
      IDA_mem_00->ida_rootdir = (int *)0x0;
      free(IDA_mem_00->ida_gactive);
      IDA_mem_00->ida_gactive = (int *)0x0;
    }
    free((void *)*in_RDI);
    *in_RDI = 0;
  }
  return;
}

Assistant:

void IDAFree(void** ida_mem)
{
  IDAMem IDA_mem;

  if (*ida_mem == NULL) { return; }

  IDA_mem = (IDAMem)(*ida_mem);

  IDAFreeVectors(IDA_mem);

  /* if IDA created the NLS object then free it */
  if (IDA_mem->ownNLS)
  {
    SUNNonlinSolFree(IDA_mem->NLS);
    IDA_mem->ownNLS = SUNFALSE;
    IDA_mem->NLS    = NULL;
  }

  if (IDA_mem->ida_lfree != NULL) { IDA_mem->ida_lfree(IDA_mem); }

  if (IDA_mem->ida_nrtfn > 0)
  {
    free(IDA_mem->ida_glo);
    IDA_mem->ida_glo = NULL;
    free(IDA_mem->ida_ghi);
    IDA_mem->ida_ghi = NULL;
    free(IDA_mem->ida_grout);
    IDA_mem->ida_grout = NULL;
    free(IDA_mem->ida_iroots);
    IDA_mem->ida_iroots = NULL;
    free(IDA_mem->ida_rootdir);
    IDA_mem->ida_rootdir = NULL;
    free(IDA_mem->ida_gactive);
    IDA_mem->ida_gactive = NULL;
  }

  free(*ida_mem);
  *ida_mem = NULL;
}